

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O2

void __thiscall libcalc::Token::Token(Token *this,char symbol)

{
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  this->type = '\0';
  push(this,symbol);
  return;
}

Assistant:

Token::Token(const char symbol) {
  push(symbol);
}